

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsGetWeakReferenceValue(JsWeakRef weakRef,JsValueRef *value)

{
  JsErrorCode JVar1;
  AutoNestedHandledExceptionType local_38 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (weakRef == (JsWeakRef)0x0) {
    JVar1 = JsErrorInvalidArgument;
  }
  else if (value == (JsValueRef *)0x0) {
    JVar1 = JsErrorNullArgument;
  }
  else {
    *value = (JsValueRef)0x0;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_38,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    *value = *weakRef;
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_38);
    JVar1 = JsNoError;
  }
  return JVar1;
}

Assistant:

CHAKRA_API JsGetWeakReferenceValue(
    _In_ JsWeakRef weakRef,
    _Out_ JsValueRef* value)
{
    VALIDATE_JSREF(weakRef);
    PARAM_NOT_NULL(value);
    *value = JS_INVALID_REFERENCE;

    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        Memory::RecyclerWeakReference<char>* recyclerWeakReference =
            reinterpret_cast<Memory::RecyclerWeakReference<char>*>(weakRef);
        *value = reinterpret_cast<JsValueRef>(recyclerWeakReference->Get());
        return JsNoError;
    });
}